

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O3

Error __thiscall asmjit::CodeCompiler::setArg(CodeCompiler *this,uint32_t argIndex,Reg *r)

{
  uint32_t uVar1;
  CCFunc *pCVar2;
  Error EVar3;
  CCHint *node;
  uint32_t value;
  uint32_t hint;
  undefined4 in_register_00000034;
  Reg *r_00;
  
  r_00 = (Reg *)CONCAT44(in_register_00000034,argIndex);
  pCVar2 = this->_func;
  if (pCVar2 == (CCFunc *)0x0) {
    EVar3 = 4;
  }
  else {
    uVar1 = (r->super_Operand).super_Operand_.field_0._any.id;
    value = uVar1 - 0x100;
    if ((ulong)value < (this->_vRegArray).super_ZoneVectorBase._length) {
      if (uVar1 == 0xffffffff) {
        setArg();
      }
      else if (argIndex < (pCVar2->_funcDetail)._argCount) {
        pCVar2->_args[argIndex] =
             *(VirtReg **)((long)(this->_vRegArray).super_ZoneVectorBase._data + (ulong)value * 8);
        return 0;
      }
      setArg();
      if (0xff < (r_00->super_Operand).super_Operand_.field_0._any.id) {
        node = newHintNode(this,r_00,hint,value);
        if (node == (CCHint *)0x0) {
          EVar3 = CodeEmitter::setLastError((CodeEmitter *)this,1,(char *)0x0);
          return EVar3;
        }
        CodeBuilder::addNode(&this->super_CodeBuilder,&node->super_CBNode);
      }
      return 0;
    }
    EVar3 = 0x1a;
  }
  EVar3 = CodeEmitter::setLastError((CodeEmitter *)this,EVar3,(char *)0x0);
  return EVar3;
}

Assistant:

Error CodeCompiler::setArg(uint32_t argIndex, const Reg& r) {
  CCFunc* func = getFunc();

  if (!func)
    return setLastError(DebugUtils::errored(kErrorInvalidState));

  if (!isVirtRegValid(r))
    return setLastError(DebugUtils::errored(kErrorInvalidVirtId));

  VirtReg* vr = getVirtReg(r);
  func->setArg(argIndex, vr);

  return kErrorOk;
}